

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_status_t bpptree_delete(ion_dictionary_t *dictionary,ion_key_t key)

{
  ion_err_t iVar1;
  uint local_40;
  ion_file_offset_t local_38;
  ion_file_offset_t offset;
  ion_dictionary_parent_t *piStack_28;
  ion_bpp_err_t bErr;
  ion_bpptree_t *bpptree;
  ion_key_t key_local;
  ion_dictionary_t *dictionary_local;
  ion_status_t status;
  
  local_40 = CONCAT31(local_40._1_3_,0x12);
  dictionary_local = (ion_dictionary_t *)(ulong)local_40;
  piStack_28 = dictionary->instance;
  bpptree = (ion_bpptree_t *)key;
  key_local = dictionary;
  offset._4_4_ = b_delete(*(ion_bpp_handle_t *)(piStack_28 + 1),key,&local_38);
  if (offset._4_4_ == bErrKeyNotFound) {
    dictionary_local = (ion_dictionary_t *)CONCAT71(dictionary_local._1_7_,1);
  }
  else {
    iVar1 = lfb_delete_all((ion_lfb_t *)&piStack_28[1].record.value_size,local_38,
                           (ion_result_count_t *)((long)&dictionary_local + 4));
    dictionary_local = (ion_dictionary_t *)CONCAT71(dictionary_local._1_7_,iVar1);
  }
  return (ion_status_t)dictionary_local;
}

Assistant:

ion_status_t
bpptree_delete(
	ion_dictionary_t	*dictionary,
	ion_key_t			key
) {
	ion_bpptree_t		*bpptree;
	ion_bpp_err_t		bErr;
	ion_file_offset_t	offset;
	ion_status_t		status;

	status	= ION_STATUS_INITIALIZE;

	bpptree = (ion_bpptree_t *) dictionary->instance;

	bErr	= b_delete(bpptree->tree, key, &offset);

	if (bErrKeyNotFound != bErr) {
		status.error = lfb_delete_all(&(bpptree->values), offset, &(status.count));
	}
	else {
		status.error = err_item_not_found;
	}

	return status;
}